

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001f3d20 = 0x2e2e2e2e2e2e2e;
    uRam00000000001f3d27._0_1_ = '.';
    uRam00000000001f3d27._1_1_ = '.';
    uRam00000000001f3d27._2_1_ = '.';
    uRam00000000001f3d27._3_1_ = '.';
    uRam00000000001f3d27._4_1_ = '.';
    uRam00000000001f3d27._5_1_ = '.';
    uRam00000000001f3d27._6_1_ = '.';
    uRam00000000001f3d27._7_1_ = '.';
    DAT_001f3d10 = '.';
    DAT_001f3d10_1._0_1_ = '.';
    DAT_001f3d10_1._1_1_ = '.';
    DAT_001f3d10_1._2_1_ = '.';
    DAT_001f3d10_1._3_1_ = '.';
    DAT_001f3d10_1._4_1_ = '.';
    DAT_001f3d10_1._5_1_ = '.';
    DAT_001f3d10_1._6_1_ = '.';
    uRam00000000001f3d18 = 0x2e2e2e2e2e2e2e;
    DAT_001f3d1f = 0x2e;
    DAT_001f3d00 = '.';
    DAT_001f3d00_1._0_1_ = '.';
    DAT_001f3d00_1._1_1_ = '.';
    DAT_001f3d00_1._2_1_ = '.';
    DAT_001f3d00_1._3_1_ = '.';
    DAT_001f3d00_1._4_1_ = '.';
    DAT_001f3d00_1._5_1_ = '.';
    DAT_001f3d00_1._6_1_ = '.';
    uRam00000000001f3d08._0_1_ = '.';
    uRam00000000001f3d08._1_1_ = '.';
    uRam00000000001f3d08._2_1_ = '.';
    uRam00000000001f3d08._3_1_ = '.';
    uRam00000000001f3d08._4_1_ = '.';
    uRam00000000001f3d08._5_1_ = '.';
    uRam00000000001f3d08._6_1_ = '.';
    uRam00000000001f3d08._7_1_ = '.';
    DAT_001f3cf0 = '.';
    DAT_001f3cf0_1._0_1_ = '.';
    DAT_001f3cf0_1._1_1_ = '.';
    DAT_001f3cf0_1._2_1_ = '.';
    DAT_001f3cf0_1._3_1_ = '.';
    DAT_001f3cf0_1._4_1_ = '.';
    DAT_001f3cf0_1._5_1_ = '.';
    DAT_001f3cf0_1._6_1_ = '.';
    uRam00000000001f3cf8._0_1_ = '.';
    uRam00000000001f3cf8._1_1_ = '.';
    uRam00000000001f3cf8._2_1_ = '.';
    uRam00000000001f3cf8._3_1_ = '.';
    uRam00000000001f3cf8._4_1_ = '.';
    uRam00000000001f3cf8._5_1_ = '.';
    uRam00000000001f3cf8._6_1_ = '.';
    uRam00000000001f3cf8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001f3ce8._0_1_ = '.';
    uRam00000000001f3ce8._1_1_ = '.';
    uRam00000000001f3ce8._2_1_ = '.';
    uRam00000000001f3ce8._3_1_ = '.';
    uRam00000000001f3ce8._4_1_ = '.';
    uRam00000000001f3ce8._5_1_ = '.';
    uRam00000000001f3ce8._6_1_ = '.';
    uRam00000000001f3ce8._7_1_ = '.';
    DAT_001f3d2f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}